

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_benchmark.c
# Opt level: O1

void run_test(uint32_t spanlen,uint32_t intvlen,double density,order_t order)

{
  double dVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  undefined1 *puVar5;
  roaring_bitmap_t *prVar6;
  uint uVar7;
  size_t i;
  roaring_bitmap_t *prVar8;
  long lVar9;
  uint32_t *puVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  uint32_t *puVar15;
  ulong uVar16;
  double dVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint32_t local_118 [10];
  undefined8 uStack_f0;
  undefined1 local_e0 [8];
  timespec ts_5;
  uint32_t *local_98;
  uint32_t *offsets;
  double local_88;
  undefined1 *local_80;
  uint local_74;
  long lStack_70;
  uint32_t count;
  undefined1 *local_68;
  undefined1 *local_60;
  double local_58;
  roaring_bitmap_t *local_50;
  undefined1 auStack_48 [8];
  timespec ts;
  
  uVar18 = (ulong)intvlen;
  if (order == ASC) {
    pcVar13 = "ASC";
  }
  else if (order == DESC) {
    pcVar13 = "DESC";
  }
  else {
    pcVar13 = "???";
    if (order == SHUFFLE) {
      pcVar13 = "SHUFFLE";
    }
  }
  uStack_f0 = 0x101555;
  local_58 = density;
  printf("intvlen=%u density=%f order=%s\n",uVar18,pcVar13);
  uStack_f0 = 0x10157c;
  make_data(spanlen,intvlen,local_58,order,&local_98,&local_74);
  local_50 = (roaring_bitmap_t *)0x0;
  offsets = local_118;
  printf("  roaring_bitmap_add():");
  puVar3 = local_98;
  uVar12 = (ulong)local_74;
  local_80 = (undefined1 *)(double)uVar12;
  local_60 = (undefined1 *)(double)uVar18;
  local_58 = (double)uVar18;
  do {
    prVar8 = roaring_bitmap_create_with_capacity(0);
    clock_gettime(3,(timespec *)auStack_48);
    local_68 = (undefined1 *)auStack_48;
    lStack_70 = ts.tv_sec;
    if (uVar12 != 0) {
      uVar16 = 0;
      dVar17 = local_58;
      do {
        if (SUB84(dVar17,0) != 0) {
          iVar14 = 0;
          do {
            roaring_bitmap_add(prVar8,puVar3[uVar16] + iVar14);
            iVar14 = iVar14 + 1;
            dVar17 = local_58;
          } while (SUB84(local_58,0) != iVar14);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar12);
    }
    clock_gettime(3,(timespec *)auStack_48);
    prVar6 = local_50;
    lVar9 = ((long)auStack_48 - (long)local_68) * 1000000000 + (ts.tv_sec - lStack_70);
    auVar19._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar19._0_8_ = lVar9;
    auVar19._12_4_ = 0x45300000;
    *(double *)(offsets + (long)local_50 * 2) =
         (((auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / (double)local_80) /
         (double)local_60;
    roaring_bitmap_free(prVar8);
    local_50 = (roaring_bitmap_t *)((long)&(prVar6->high_low_container).size + 1);
  } while (local_50 != (roaring_bitmap_t *)0x5);
  lVar9 = 1;
  dVar17 = *(double *)offsets;
  do {
    dVar1 = *(double *)(offsets + lVar9 * 2);
    if (dVar17 <= *(double *)(offsets + lVar9 * 2)) {
      dVar1 = dVar17;
    }
    lVar9 = lVar9 + 1;
    dVar17 = dVar1;
  } while (lVar9 != 5);
  printf("          %6.1f\n");
  lVar9 = 0;
  printf("  roaring_bitmap_add_many():");
  puVar3 = local_98;
  local_88 = (double)(ulong)local_74;
  uVar7 = local_74 * local_58._0_4_;
  ts_5.tv_nsec = (__syscall_slong_t)(double)(long)local_88;
  puVar10 = local_118;
  do {
    lStack_70 = lVar9;
    puVar10[-2] = 0x101764;
    puVar10[-1] = 0;
    local_50 = roaring_bitmap_create_with_capacity(0);
    dVar1 = local_58;
    dVar17 = local_88;
    puVar15 = (uint32_t *)((long)puVar10 - ((ulong)uVar7 * 4 + 0xf & 0xfffffffffffffff0));
    local_68 = (undefined1 *)puVar10;
    if (local_88 != 0.0) {
      uVar12 = 0;
      puVar10 = puVar15;
      do {
        if (SUB84(dVar1,0) != 0) {
          uVar16 = 0;
          do {
            puVar10[uVar16] = puVar3[uVar12] + (int)uVar16;
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
        }
        uVar12 = uVar12 + 1;
        puVar10 = puVar10 + uVar18;
      } while ((double)uVar12 != dVar17);
    }
    puVar15[-2] = 0x1017c8;
    puVar15[-1] = 0;
    clock_gettime(3,(timespec *)auStack_48);
    puVar10 = puVar15;
    local_60 = (undefined1 *)auStack_48;
    local_80 = (undefined1 *)ts.tv_sec;
    prVar8 = local_50;
    for (; local_50 = prVar8, dVar17 != 0.0; dVar17 = (double)((long)dVar17 - 1)) {
      puVar15[-2] = 0x1017ec;
      puVar15[-1] = 0;
      roaring_bitmap_add_many(prVar8,uVar18,puVar10);
      puVar10 = puVar10 + uVar18;
      prVar8 = local_50;
    }
    puVar15[-2] = 0x101802;
    puVar15[-1] = 0;
    clock_gettime(3,(timespec *)auStack_48);
    prVar8 = local_50;
    lVar9 = lStack_70;
    puVar4 = offsets;
    lVar11 = ((long)auStack_48 - (long)local_60) * 1000000000 + (ts.tv_sec - (long)local_80);
    auVar20._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar20._0_8_ = lVar11;
    auVar20._12_4_ = 0x45300000;
    *(double *)(offsets + lStack_70 * 2) =
         (((auVar20._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / (double)ts_5.tv_nsec) /
         (double)uVar18;
    puVar15[-2] = 0x101867;
    puVar15[-1] = 0;
    roaring_bitmap_free(prVar8);
    puVar5 = local_68;
    lVar9 = lVar9 + 1;
    puVar10 = (uint32_t *)local_68;
  } while (lVar9 != 5);
  lVar9 = 1;
  dVar17 = *(double *)puVar4;
  do {
    dVar1 = *(double *)(puVar4 + lVar9 * 2);
    if (dVar17 <= dVar1) {
      dVar1 = dVar17;
    }
    lVar9 = lVar9 + 1;
    dVar17 = dVar1;
  } while (lVar9 != 5);
  *(undefined8 *)(local_68 + -8) = 0x1018a7;
  printf("     %6.1f\n");
  lVar9 = 0;
  *(undefined8 *)(puVar5 + -8) = 0x1018b8;
  printf("  roaring_bitmap_add_bulk():");
  puVar3 = local_98;
  local_50 = (roaring_bitmap_t *)(ulong)local_74;
  local_60 = (undefined1 *)(double)(long)local_50;
  local_88 = (double)uVar18;
  do {
    lStack_70 = lVar9;
    *(undefined8 *)(puVar5 + -8) = 0x1018ef;
    prVar8 = roaring_bitmap_create_with_capacity(0);
    *(undefined8 *)(puVar5 + -8) = 0x1018ff;
    clock_gettime(3,(timespec *)auStack_48);
    local_80 = (undefined1 *)auStack_48;
    local_68 = (undefined1 *)ts.tv_sec;
    auStack_48 = (undefined1  [8])0x0;
    ts.tv_sec = 0;
    if (local_50 != (roaring_bitmap_t *)0x0) {
      uVar12 = 0;
      dVar17 = local_58;
      do {
        if (SUB84(dVar17,0) != 0) {
          iVar14 = 0;
          do {
            uVar2 = puVar3[uVar12];
            *(undefined8 *)(puVar5 + -8) = 0x10193e;
            roaring_bitmap_add_bulk(prVar8,(roaring_bulk_context_t *)auStack_48,uVar2 + iVar14);
            iVar14 = iVar14 + 1;
            dVar17 = local_58;
          } while (SUB84(local_58,0) != iVar14);
        }
        uVar12 = uVar12 + 1;
      } while ((roaring_bitmap_t *)uVar12 != local_50);
    }
    *(undefined8 *)(puVar5 + -8) = 0x101962;
    clock_gettime(3,(timespec *)local_e0);
    lVar9 = lStack_70;
    puVar10 = offsets;
    lVar11 = ((long)local_e0 - (long)local_80) * 1000000000 + (ts_5.tv_sec - (long)local_68);
    auVar21._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar21._0_8_ = lVar11;
    auVar21._12_4_ = 0x45300000;
    *(double *)(offsets + lStack_70 * 2) =
         (((auVar21._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / (double)local_60) /
         local_88;
    *(undefined8 *)(puVar5 + -8) = 0x1019c6;
    roaring_bitmap_free(prVar8);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  lVar9 = 1;
  dVar17 = *(double *)puVar10;
  do {
    dVar1 = *(double *)(puVar10 + lVar9 * 2);
    if (dVar17 <= dVar1) {
      dVar1 = dVar17;
    }
    lVar9 = lVar9 + 1;
    dVar17 = dVar1;
  } while (lVar9 != 5);
  *(undefined8 *)(puVar5 + -8) = 0x101a00;
  printf("     %6.1f\n");
  lVar9 = 0;
  *(undefined8 *)(puVar5 + -8) = 0x101a11;
  printf("  roaring_bitmap_add_range():");
  puVar3 = local_98;
  uVar12 = (ulong)local_74;
  local_80 = (undefined1 *)(double)uVar12;
  local_60 = (undefined1 *)(double)uVar18;
  do {
    local_50 = (roaring_bitmap_t *)lVar9;
    *(undefined8 *)(puVar5 + -8) = 0x101a49;
    prVar8 = roaring_bitmap_create_with_capacity(0);
    *(undefined8 *)(puVar5 + -8) = 0x101a59;
    clock_gettime(3,(timespec *)auStack_48);
    local_68 = (undefined1 *)auStack_48;
    lStack_70 = ts.tv_sec;
    if (uVar12 != 0) {
      uVar16 = 0;
      dVar17 = local_58;
      do {
        uVar2 = puVar3[uVar16];
        uVar7 = uVar2 + SUB84(dVar17,0);
        if (uVar2 < uVar7) {
          *(undefined8 *)(puVar5 + -8) = 0x101a8b;
          roaring_bitmap_add_range_closed(prVar8,uVar2,uVar7 - 1);
          dVar17 = local_58;
        }
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
    }
    *(undefined8 *)(puVar5 + -8) = 0x101aa8;
    clock_gettime(3,(timespec *)auStack_48);
    prVar6 = local_50;
    lVar9 = ((long)auStack_48 - (long)local_68) * 1000000000 + (ts.tv_sec - lStack_70);
    auVar22._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar22._0_8_ = lVar9;
    auVar22._12_4_ = 0x45300000;
    *(double *)(offsets + (long)local_50 * 2) =
         (((auVar22._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / (double)local_80) /
         (double)local_60;
    *(undefined8 *)(puVar5 + -8) = 0x101b06;
    roaring_bitmap_free(prVar8);
    lVar9 = (long)prVar6 + 1;
  } while (lVar9 != 5);
  lVar9 = 1;
  dVar17 = *(double *)offsets;
  do {
    dVar1 = *(double *)(offsets + lVar9 * 2);
    if (dVar17 <= *(double *)(offsets + lVar9 * 2)) {
      dVar1 = dVar17;
    }
    lVar9 = lVar9 + 1;
    dVar17 = dVar1;
  } while (lVar9 != 5);
  *(undefined8 *)(puVar5 + -8) = 0x101b47;
  printf("    %6.1f\n");
  lVar9 = 0;
  *(undefined8 *)(puVar5 + -8) = 0x101b58;
  printf("  roaring_bitmap_remove():");
  puVar3 = local_98;
  local_80 = (undefined1 *)CONCAT44(local_80._4_4_,spanlen - 1);
  uVar12 = (ulong)local_74;
  local_60 = (undefined1 *)(double)uVar12;
  local_88 = (double)uVar18;
  do {
    local_50 = (roaring_bitmap_t *)lVar9;
    *(undefined8 *)(puVar5 + -8) = 0x101b98;
    prVar8 = roaring_bitmap_create_with_capacity(0);
    if (spanlen != 0) {
      uVar2 = (uint32_t)local_80;
      *(undefined8 *)(puVar5 + -8) = 0x101bb1;
      roaring_bitmap_add_range_closed(prVar8,0,uVar2);
    }
    *(undefined8 *)(puVar5 + -8) = 0x101bbf;
    clock_gettime(3,(timespec *)auStack_48);
    local_68 = (undefined1 *)auStack_48;
    lStack_70 = ts.tv_sec;
    if (uVar12 != 0) {
      uVar16 = 0;
      dVar17 = local_58;
      do {
        if (SUB84(dVar17,0) != 0) {
          iVar14 = 0;
          do {
            uVar2 = puVar3[uVar16];
            *(undefined8 *)(puVar5 + -8) = 0x101bef;
            roaring_bitmap_remove(prVar8,uVar2 + iVar14);
            iVar14 = iVar14 + 1;
            dVar17 = local_58;
          } while (SUB84(local_58,0) != iVar14);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar12);
    }
    *(undefined8 *)(puVar5 + -8) = 0x101c0f;
    clock_gettime(3,(timespec *)auStack_48);
    prVar6 = local_50;
    puVar10 = offsets;
    lVar9 = ((long)auStack_48 - (long)local_68) * 1000000000 + (ts.tv_sec - lStack_70);
    auVar23._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar23._0_8_ = lVar9;
    auVar23._12_4_ = 0x45300000;
    *(double *)(offsets + (long)local_50 * 2) =
         (((auVar23._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / (double)local_60) /
         local_88;
    *(undefined8 *)(puVar5 + -8) = 0x101c6d;
    roaring_bitmap_free(prVar8);
    lVar9 = (long)prVar6 + 1;
  } while (lVar9 != 5);
  lVar9 = 1;
  dVar17 = *(double *)puVar10;
  do {
    dVar1 = *(double *)(puVar10 + lVar9 * 2);
    if (dVar17 <= *(double *)(puVar10 + lVar9 * 2)) {
      dVar1 = dVar17;
    }
    lVar9 = lVar9 + 1;
    dVar17 = dVar1;
  } while (lVar9 != 5);
  *(undefined8 *)(puVar5 + -8) = 0x101ca7;
  printf("       %6.1f\n");
  lVar9 = 0;
  *(undefined8 *)(puVar5 + -8) = 0x101cb8;
  printf("  roaring_bitmap_remove_range():");
  puVar3 = local_98;
  uVar12 = (ulong)local_74;
  local_60 = (undefined1 *)(double)uVar12;
  local_88 = (double)uVar18;
  do {
    local_50 = (roaring_bitmap_t *)lVar9;
    *(undefined8 *)(puVar5 + -8) = 0x101cec;
    prVar8 = roaring_bitmap_create_with_capacity(0);
    if (spanlen != 0) {
      uVar2 = (uint32_t)local_80;
      *(undefined8 *)(puVar5 + -8) = 0x101d05;
      roaring_bitmap_add_range_closed(prVar8,0,uVar2);
    }
    *(undefined8 *)(puVar5 + -8) = 0x101d13;
    clock_gettime(3,(timespec *)auStack_48);
    local_68 = (undefined1 *)auStack_48;
    lStack_70 = ts.tv_sec;
    if (uVar12 != 0) {
      uVar18 = 0;
      dVar17 = local_58;
      do {
        uVar2 = puVar3[uVar18];
        uVar7 = uVar2 + SUB84(dVar17,0);
        if (uVar2 < uVar7) {
          *(undefined8 *)(puVar5 + -8) = 0x101d44;
          roaring_bitmap_remove_range_closed(prVar8,uVar2,uVar7 - 1);
          dVar17 = local_58;
        }
        uVar18 = uVar18 + 1;
      } while (uVar12 != uVar18);
    }
    *(undefined8 *)(puVar5 + -8) = 0x101d5e;
    clock_gettime(3,(timespec *)auStack_48);
    prVar6 = local_50;
    lVar9 = ((long)auStack_48 - (long)local_68) * 1000000000 + (ts.tv_sec - lStack_70);
    auVar24._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar24._0_8_ = lVar9;
    auVar24._12_4_ = 0x45300000;
    *(double *)(puVar10 + (long)local_50 * 2) =
         (((auVar24._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / (double)local_60) /
         local_88;
    *(undefined8 *)(puVar5 + -8) = 0x101db5;
    roaring_bitmap_free(prVar8);
    lVar9 = (long)prVar6 + 1;
  } while (lVar9 != 5);
  lVar9 = 0;
  dVar17 = *(double *)puVar10;
  do {
    dVar1 = *(double *)(puVar10 + lVar9 * 2 + 2);
    if (dVar17 <= *(double *)(puVar10 + lVar9 * 2 + 2)) {
      dVar1 = dVar17;
    }
    lVar9 = lVar9 + 1;
    dVar17 = dVar1;
  } while (lVar9 != 4);
  *(undefined8 *)(puVar5 + -8) = 0x101ded;
  printf(" %6.1f\n");
  *(undefined8 *)(puVar5 + -8) = 0x101df9;
  free(local_98);
  return;
}

Assistant:

void run_test(uint32_t spanlen, uint32_t intvlen, double density,
              order_t order) {
    printf("intvlen=%u density=%f order=%s\n", intvlen, density,
           (order == ASC
                ? "ASC"
                : (order == DESC ? "DESC"
                                 : (order == SHUFFLE ? "SHUFFLE" : "???"))));

    uint32_t *offsets;
    uint32_t count;
    make_data(spanlen, intvlen, density, order, &offsets, &count);
    const int num_passes = 5;
    uint64_t cycles_start, cycles_final;
    double results[num_passes];

    printf("  roaring_bitmap_add():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("          %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_many():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        uint32_t values[intvlen * count];
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                values[i * intvlen + j] = offsets[i] + j;
            }
        }
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_many(r, intvlen, values + (i * intvlen));
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_bulk():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        roaring_bulk_context_t context = {0, 0, 0, 0};
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add_bulk(r, &context, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("    %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_remove(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("       %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_remove_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf(" %6.1f\n", array_min(results, num_passes));

    free(offsets);
}